

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZoneNamesImpl::loadAllDisplayNames(TimeZoneNamesImpl *this,UErrorCode *status)

{
  Mutex lock;
  Mutex local_18;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_18.fMutex = (UMutex *)gDataMutex;
    umtx_lock_63((UMutex *)gDataMutex);
    internalLoadAllDisplayNames(this,status);
    Mutex::~Mutex(&local_18);
  }
  return;
}

Assistant:

const UChar* getName(UTimeZoneNameType type) const {
        UTimeZoneNameTypeIndex index = getTZNameTypeIndex(type);
        return index >= 0 ? fNames[index] : NULL;
    }